

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

float ON_Min(float a,float b)

{
  if (b < a) {
    if (b < a) {
      return b;
    }
    a = (float)(~-(uint)(!NAN(b) && !NAN(b)) & (uint)a | (uint)b & -(uint)(!NAN(b) && !NAN(b)));
  }
  return a;
}

Assistant:

float ON_Min(float a, float b)
{
  if (a <= b)
    return a;
  if (b < a)
    return b;
  
  // If one is a NaN and the other isn't, return the valid value.
  return (!(b==b)) ? a : b;
}